

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O3

Vector3D * __thiscall CMU462::Vertex::normal(Vector3D *__return_storage_ptr__,Vertex *this)

{
  double dVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  double dVar4;
  double dVar5;
  bool bVar6;
  HalfedgeIter h;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  __return_storage_ptr__->z = 0.0;
  dVar12 = (this->position).x;
  dVar4 = (this->position).y;
  dVar5 = (this->position).z;
  p_Var8 = (this->_halfedge)._M_node;
  p_Var7 = p_Var8;
  do {
    bVar6 = Halfedge::isBoundary((Halfedge *)(p_Var7 + 1));
    if (bVar6) {
      dVar9 = __return_storage_ptr__->x;
      dVar10 = __return_storage_ptr__->y;
      dVar1 = __return_storage_ptr__->z;
      do {
        p_Var7 = p_Var8[2]._M_next;
        p_Var2 = p_Var7[2]._M_prev;
        p_Var8 = p_Var7[1]._M_prev;
        p_Var7 = p_Var7[2]._M_next[2]._M_prev;
        dVar11 = (double)p_Var2[1]._M_prev - dVar12;
        dVar13 = (double)p_Var7[2]._M_next - dVar4;
        dVar14 = (double)p_Var2[2]._M_next - dVar4;
        dVar15 = (double)p_Var2[2]._M_prev - dVar5;
        dVar16 = (double)p_Var7[2]._M_prev - dVar5;
        dVar17 = (double)p_Var7[1]._M_prev - dVar12;
        dVar9 = dVar9 + (dVar14 * dVar16 - dVar13 * dVar15);
        dVar10 = dVar10 + (dVar15 * dVar17 - dVar16 * dVar11);
        dVar1 = dVar1 + (dVar11 * dVar13 - dVar17 * dVar14);
      } while (p_Var8 != (this->_halfedge)._M_node);
      goto LAB_0016fa65;
    }
    p_Var7 = p_Var7[1]._M_prev[2]._M_next;
  } while ((this->_halfedge)._M_node != p_Var7);
  dVar9 = __return_storage_ptr__->x;
  dVar10 = __return_storage_ptr__->y;
  dVar1 = __return_storage_ptr__->z;
  do {
    p_Var2 = p_Var8[2]._M_next[2]._M_prev;
    p_Var3 = p_Var8[2]._M_next[2]._M_next[2]._M_prev;
    dVar11 = (double)p_Var2[1]._M_prev - dVar12;
    dVar13 = (double)p_Var3[2]._M_next - dVar4;
    dVar14 = (double)p_Var2[2]._M_next - dVar4;
    dVar15 = (double)p_Var2[2]._M_prev - dVar5;
    dVar16 = (double)p_Var3[2]._M_prev - dVar5;
    dVar17 = (double)p_Var3[1]._M_prev - dVar12;
    dVar9 = dVar9 + (dVar14 * dVar16 - dVar13 * dVar15);
    dVar10 = dVar10 + (dVar15 * dVar17 - dVar16 * dVar11);
    dVar1 = dVar1 + (dVar11 * dVar13 - dVar17 * dVar14);
    p_Var8 = p_Var8[1]._M_prev[2]._M_next;
  } while (p_Var8 != p_Var7);
LAB_0016fa65:
  dVar12 = 1.0 / SQRT(dVar1 * dVar1 + dVar9 * dVar9 + dVar10 * dVar10);
  __return_storage_ptr__->x = dVar12 * dVar9;
  __return_storage_ptr__->y = dVar12 * dVar10;
  __return_storage_ptr__->z = dVar1 * dVar12;
  return __return_storage_ptr__;
}

Assistant:

Vector3D normal() const {
          Vector3D N( 0., 0., 0. );
          Vector3D pi = position;

          // Iterate over neighbors.
          HalfedgeCIter h = halfedge();
          if (isBoundary()) {
            do {
              Vector3D pj = h->next()->vertex()->position;
              Vector3D pk = h->next()->next()->vertex()->position;
              N += cross( pj-pi, pk-pi );
              h = h->next()->twin();
            } while( h != halfedge() );      
          } else {
            do {
              Vector3D pj = h->next()->vertex()->position;
              Vector3D pk = h->next()->next()->vertex()->position;
              N += cross( pj-pi, pk-pi );
              h = h->twin()->next();
            } while( h != halfedge() );
          }

          N.normalize();

          return N;
        }